

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# staj_cursor.hpp
# Opt level: O2

void __thiscall
jsoncons::basic_staj_filter_view<char>::basic_staj_filter_view
          (basic_staj_filter_view<char> *this,basic_staj_cursor<char> *cursor,
          function<bool_(const_jsoncons::basic_staj_event<char>_&,_const_jsoncons::ser_context_&)>
          *pred)

{
  bool bVar1;
  int iVar2;
  int iVar3;
  undefined4 extraout_var;
  undefined4 extraout_var_00;
  
  (this->super_basic_staj_cursor<char>)._vptr_basic_staj_cursor =
       (_func_int **)&PTR__basic_staj_filter_view_0099a448;
  this->cursor_ = cursor;
  std::function<bool_(const_jsoncons::basic_staj_event<char>_&,_const_jsoncons::ser_context_&)>::
  function(&this->pred_,pred);
  while( true ) {
    iVar2 = (*(this->super_basic_staj_cursor<char>)._vptr_basic_staj_cursor[3])(this);
    if ((char)iVar2 != '\0') {
      return;
    }
    iVar2 = (*(this->super_basic_staj_cursor<char>)._vptr_basic_staj_cursor[4])(this);
    iVar3 = (*(this->super_basic_staj_cursor<char>)._vptr_basic_staj_cursor[9])(this);
    bVar1 = std::
            function<bool_(const_jsoncons::basic_staj_event<char>_&,_const_jsoncons::ser_context_&)>
            ::operator()(&this->pred_,(basic_staj_event<char> *)CONCAT44(extraout_var,iVar2),
                         (ser_context *)CONCAT44(extraout_var_00,iVar3));
    if (bVar1) break;
    (*this->cursor_->_vptr_basic_staj_cursor[7])();
  }
  return;
}

Assistant:

basic_staj_filter_view(basic_staj_cursor<CharT>& cursor, 
                     std::function<bool(const basic_staj_event<CharT>&, const ser_context&)> pred)
        : cursor_(std::addressof(cursor)), pred_(pred)
    {
        while (!done() && !pred_(current(),context()))
        {
            cursor_->next();
        }
    }